

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

TSParser * ts_parser_new(void)

{
  TSParser *pTVar1;
  ReduceAction *pRVar2;
  Stack *pSVar3;
  void *pvVar4;
  StackHead *pSVar5;
  _func_void_TSLexer_ptr *p_Var6;
  _func__Bool_TSLexer_ptr *p_Var7;
  StackNode *pSVar8;
  TSParser *extraout_RAX;
  TSParser *extraout_RAX_00;
  TSParser *extraout_RAX_01;
  TSParser *extraout_RAX_02;
  TSParser *extraout_RAX_03;
  Subtree in_RCX;
  Subtree self;
  uint uVar9;
  undefined4 uVar10;
  TSParser *pTVar11;
  long lVar12;
  SubtreePool *__size;
  uint32_t *pool;
  SubtreePool local_38;
  
  pTVar11 = (TSParser *)0x1;
  uVar9 = 0x5c8;
  pTVar1 = (TSParser *)calloc(1,0x5c8);
  if (pTVar1 == (TSParser *)0x0) {
    ts_parser_new_cold_2();
  }
  else {
    ts_lexer_init((Lexer *)pTVar1);
    pTVar11 = (TSParser *)0x4;
    uVar9 = 0x10;
    pRVar2 = (ReduceAction *)calloc(4,0x10);
    (pTVar1->reduce_actions).contents = (ReduceAction *)0x0;
    (pTVar1->reduce_actions).size = 0;
    (pTVar1->reduce_actions).capacity = 0;
    if (pRVar2 != (ReduceAction *)0x0) {
      (pTVar1->reduce_actions).contents = pRVar2;
      (pTVar1->reduce_actions).capacity = 4;
      ts_subtree_pool_new(&local_38,0x20);
      (pTVar1->tree_pool).tree_stack.contents = local_38.tree_stack.contents;
      (pTVar1->tree_pool).tree_stack.size = local_38.tree_stack.size;
      (pTVar1->tree_pool).tree_stack.capacity = local_38.tree_stack.capacity;
      (pTVar1->tree_pool).free_trees.contents = local_38.free_trees.contents;
      (pTVar1->tree_pool).free_trees.size = local_38.free_trees.size;
      (pTVar1->tree_pool).free_trees.capacity = local_38.free_trees.capacity;
      pSVar3 = ts_stack_new(&pTVar1->tree_pool);
      pTVar1->stack = pSVar3;
      (pTVar1->finished_tree).ptr = (SubtreeHeapData *)0x0;
      (pTVar1->reusable_node).stack.contents = (StackEntry *)0x0;
      (pTVar1->reusable_node).stack.size = 0;
      (pTVar1->reusable_node).stack.capacity = 0;
      (pTVar1->reusable_node).last_external_token.ptr = (SubtreeHeapData *)0x0;
      pTVar1->dot_graph_file = (FILE *)0x0;
      pTVar1->halt_on_error = false;
      pTVar1->enabled = true;
      pTVar1->operation_limit = 0xffffffffffffffff;
      (pTVar1->old_tree).ptr = (SubtreeHeapData *)0x0;
      (pTVar1->scratch_tree).ptr = &pTVar1->scratch_tree_data;
      (pTVar1->included_range_differences).contents = (TSRange *)0x0;
      (pTVar1->included_range_differences).size = 0;
      (pTVar1->included_range_differences).capacity = 0;
      pTVar1->included_range_difference_index = 0;
      ts_parser__set_cached_token(pTVar1,0,(Subtree)0x0,(Subtree)0x0);
      return pTVar1;
    }
  }
  ts_parser_new_cold_1();
  (pTVar11->lexer).data.lookahead = 0;
  (pTVar11->lexer).data.result_symbol = 0;
  *(undefined2 *)&(pTVar11->lexer).data.field_0x6 = 0;
  (pTVar11->lexer).data.advance = (_func_void_TSLexer_ptr__Bool *)0x0;
  (pTVar11->lexer).data.mark_end = (_func_void_TSLexer_ptr *)0x0;
  (pTVar11->lexer).data.get_column = (_func_uint32_t_TSLexer_ptr *)0x0;
  if (uVar9 <= *(uint *)((long)&(pTVar11->lexer).data.advance + 4)) {
    return pTVar11;
  }
  pvVar4 = *(void **)&(pTVar11->lexer).data;
  __size = (SubtreePool *)(ulong)uVar9;
  if (pvVar4 != (void *)0x0) {
    __size = (SubtreePool *)((long)__size << 3);
    pvVar4 = realloc(pvVar4,(size_t)__size);
    if (pvVar4 != (void *)0x0) goto LAB_0012aa55;
    ts_subtree_pool_new_cold_1();
  }
  pvVar4 = calloc((size_t)__size,8);
  if (pvVar4 != (void *)0x0) {
LAB_0012aa55:
    *(void **)&(pTVar11->lexer).data = pvVar4;
    *(uint *)((long)&(pTVar11->lexer).data.advance + 4) = uVar9;
    return pTVar11;
  }
  ts_subtree_pool_new_cold_2();
  lVar12 = 1;
  uVar10 = 0x50;
  pTVar1 = (TSParser *)calloc(1,0x50);
  if (pTVar1 == (TSParser *)0x0) {
    ts_stack_new_cold_8();
LAB_0012abcb:
    ts_stack_new_cold_7();
LAB_0012abd0:
    ts_stack_new_cold_6();
  }
  else {
    lVar12 = 4;
    uVar10 = 0x28;
    pSVar5 = (StackHead *)calloc(4,0x28);
    *(StackHead **)&(pTVar1->lexer).data = (StackHead *)0x0;
    (pTVar1->lexer).data.advance = (_func_void_TSLexer_ptr__Bool *)0x0;
    (pTVar1->lexer).data.mark_end = (_func_void_TSLexer_ptr *)0x0;
    (pTVar1->lexer).data.get_column = (_func_uint32_t_TSLexer_ptr *)0x0;
    (pTVar1->lexer).data.is_at_included_range_start = (_func__Bool_TSLexer_ptr *)0x0;
    (pTVar1->lexer).current_position.bytes = 0;
    (pTVar1->lexer).current_position.extent.row = 0;
    *(undefined8 *)&(pTVar1->lexer).current_position.extent.column = 0;
    (pTVar1->lexer).token_start_position.extent.row = 0;
    (pTVar1->lexer).token_start_position.extent.column = 0;
    if (pSVar5 == (StackHead *)0x0) goto LAB_0012abcb;
    *(StackHead **)&(pTVar1->lexer).data = pSVar5;
    *(uint32_t *)((long)&(pTVar1->lexer).data.advance + 4) = 4;
    if (*(uint *)((long)&(pTVar1->lexer).data.get_column + 4) < 4) {
      p_Var6 = (pTVar1->lexer).data.mark_end;
      if (p_Var6 != (_func_void_TSLexer_ptr *)0x0) {
        p_Var6 = (_func_void_TSLexer_ptr *)realloc(p_Var6,0x60);
        if (p_Var6 == (_func_void_TSLexer_ptr *)0x0) {
          ts_stack_new_cold_1();
          goto LAB_0012aaec;
        }
LAB_0012ab04:
        (pTVar1->lexer).data.mark_end = p_Var6;
        *(undefined4 *)((long)&(pTVar1->lexer).data.get_column + 4) = 4;
        goto LAB_0012ab0f;
      }
LAB_0012aaec:
      lVar12 = 4;
      uVar10 = 0x18;
      p_Var6 = (_func_void_TSLexer_ptr *)calloc(4,0x18);
      if (p_Var6 != (_func_void_TSLexer_ptr *)0x0) goto LAB_0012ab04;
      goto LAB_0012abd0;
    }
LAB_0012ab0f:
    if (3 < (pTVar1->lexer).current_position.extent.row) {
LAB_0012ab55:
      pool = &(pTVar1->lexer).current_position.extent.column;
      if (0x31 < (pTVar1->lexer).token_start_position.extent.column) goto LAB_0012ab9a;
      pvVar4 = *(void **)pool;
      if (pvVar4 == (void *)0x0) {
LAB_0012ab7b:
        lVar12 = 0x32;
        uVar10 = 8;
        pvVar4 = calloc(0x32,8);
        if (pvVar4 == (void *)0x0) goto LAB_0012abda;
      }
      else {
        pvVar4 = realloc(pvVar4,400);
        if (pvVar4 == (void *)0x0) {
          ts_stack_new_cold_3();
          goto LAB_0012ab7b;
        }
      }
      *(void **)&(pTVar1->lexer).current_position.extent.column = pvVar4;
      (pTVar1->lexer).token_start_position.extent.column = 0x32;
LAB_0012ab9a:
      *(SubtreePool **)&(pTVar1->lexer).token_end_position.extent.column = __size;
      pSVar8 = stack_node_new((StackNode *)0x0,(Subtree)0x0,false,1,(StackNodeArray *)pool);
      *(StackNode **)&(pTVar1->lexer).token_end_position = pSVar8;
      ts_stack_clear((Stack *)pTVar1);
      return pTVar1;
    }
    p_Var7 = (pTVar1->lexer).data.is_at_included_range_start;
    if (p_Var7 != (_func__Bool_TSLexer_ptr *)0x0) {
      p_Var7 = (_func__Bool_TSLexer_ptr *)realloc(p_Var7,0x80);
      if (p_Var7 == (_func__Bool_TSLexer_ptr *)0x0) {
        ts_stack_new_cold_2();
        goto LAB_0012ab32;
      }
LAB_0012ab4a:
      (pTVar1->lexer).data.is_at_included_range_start = p_Var7;
      (pTVar1->lexer).current_position.extent.row = 4;
      goto LAB_0012ab55;
    }
LAB_0012ab32:
    lVar12 = 4;
    uVar10 = 0x20;
    p_Var7 = (_func__Bool_TSLexer_ptr *)calloc(4,0x20);
    if (p_Var7 != (_func__Bool_TSLexer_ptr *)0x0) goto LAB_0012ab4a;
  }
  ts_stack_new_cold_5();
LAB_0012abda:
  ts_stack_new_cold_4();
  pTVar1 = extraout_RAX;
  if (in_RCX.ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_retain(in_RCX);
    pTVar1 = extraout_RAX_00;
  }
  if (self.ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_retain(self);
    pTVar1 = extraout_RAX_01;
  }
  if ((*(Subtree *)(lVar12 + 0x550)).ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_release((SubtreePool *)(lVar12 + 0x4b0),*(Subtree *)(lVar12 + 0x550));
    pTVar1 = extraout_RAX_02;
  }
  if ((*(Subtree *)(lVar12 + 0x558)).ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_release((SubtreePool *)(lVar12 + 0x4b0),*(Subtree *)(lVar12 + 0x558));
    pTVar1 = extraout_RAX_03;
  }
  *(Subtree *)(lVar12 + 0x550) = in_RCX;
  *(undefined4 *)(lVar12 + 0x560) = uVar10;
  *(Subtree *)(lVar12 + 0x558) = self;
  return pTVar1;
}

Assistant:

TSParser *ts_parser_new() {
  TSParser *self = ts_calloc(1, sizeof(TSParser));
  ts_lexer_init(&self->lexer);
  array_init(&self->reduce_actions);
  array_reserve(&self->reduce_actions, 4);
  self->tree_pool = ts_subtree_pool_new(32);
  self->stack = ts_stack_new(&self->tree_pool);
  self->finished_tree = NULL_SUBTREE;
  self->reusable_node = reusable_node_new();
  self->dot_graph_file = NULL;
  self->halt_on_error = false;
  self->enabled = true;
  self->operation_limit = SIZE_MAX;
  self->old_tree = NULL_SUBTREE;
  self->scratch_tree.ptr = &self->scratch_tree_data;
  self->included_range_differences = (TSRangeArray) array_new();
  self->included_range_difference_index = 0;
  ts_parser__set_cached_token(self, 0, NULL_SUBTREE, NULL_SUBTREE);
  return self;
}